

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

bool doctest::anon_unknown_14::fileOrderComparator(TestCase *lhs,TestCase *rhs)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  bool bVar4;
  
  iVar3 = String::compare((String *)lhs,(String *)rhs,false);
  if (iVar3 == 0) {
    uVar1 = (rhs->super_TestCaseData).m_line;
    uVar2 = (lhs->super_TestCaseData).m_line;
    bVar4 = uVar2 < uVar1;
    if (uVar2 == uVar1) {
      bVar4 = lhs->m_template_id < rhs->m_template_id;
    }
  }
  else {
    bVar4 = SUB41((uint)iVar3 >> 0x1f,0);
  }
  return bVar4;
}

Assistant:

bool fileOrderComparator(const TestCase* lhs, const TestCase* rhs) {
        // this is needed because MSVC gives different case for drive letters
        // for __FILE__ when evaluated in a header and a source file
        const int res = lhs->m_file.compare(rhs->m_file, bool(DOCTEST_MSVC));
        if(res != 0)
            return res < 0;
        if(lhs->m_line != rhs->m_line)
            return lhs->m_line < rhs->m_line;
        return lhs->m_template_id < rhs->m_template_id;
    }